

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

QString * waitForError<QString>
                    (QString *__return_storage_ptr__,QPromise<void> *promise,QString *initial)

{
  QSharedData *pQVar1;
  Data *pDVar2;
  PromiseDataBase<void,_void_()> *pPVar3;
  bool bVar4;
  int iVar5;
  PromiseDataBase<void,_void_()> *this;
  QString *pQVar6;
  undefined7 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  QPromiseReject<void> *in_R8;
  QSharedData *pQVar7;
  PromiseResolver<void> resolver;
  Data *local_a8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_a0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_98;
  Data *local_90;
  Data *local_88;
  QString *local_80;
  QPromise<void> local_78;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  undefined7 extraout_var;
  
  pDVar2 = (initial->d).d;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = (initial->d).ptr;
  (__return_storage_ptr__->d).size = (initial->d).size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this->super_QSharedData = 0;
  (this->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->m_catchers).d.size = 0;
  (this->m_handlers).d.size = 0;
  (this->m_catchers).d.d = (Data *)0x0;
  (this->m_handlers).d.d = (Data *)0x0;
  (this->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this->m_lock = 0;
  *(undefined8 *)&this->m_settled = 0;
  (this->m_error).m_data._M_exception_object = (void *)0x0;
  this->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012cb68;
  QReadWriteLock::QReadWriteLock(&this->m_lock,0);
  this->m_settled = false;
  (this->m_handlers).d.d = (Data *)0x0;
  (this->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this->m_handlers).d.size = 0;
  (this->m_catchers).d.d = (Data *)0x0;
  (this->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->m_catchers).d.size = 0;
  (this->m_error).m_data._M_exception_object = (void *)0x0;
  this->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012caf0;
  LOCK();
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar7 = &this->super_QSharedData;
  local_78.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012ca88;
  local_78.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&local_a0,&local_78);
  local_78.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012cad0;
  if (&(local_78.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &((local_78.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (&(local_78.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (*((local_78.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (local_a0.d == (Data *)0x0) {
    local_a8 = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_a8 = local_a0.d;
    if (local_a0.d != (Data *)0x0) {
      LOCK();
      ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_98.d = local_a0.d;
      goto LAB_001106f8;
    }
  }
  local_98.d = (Data *)0x0;
LAB_001106f8:
  pPVar3 = &((promise->super_QPromiseBase<void>).m_d.d)->super_PromiseDataBase<void,_void_()>;
  QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_()> *)&local_48,(PromiseHandler<void,decltype(nullptr),void> *)0x0,
             &local_a8,(QPromiseResolve<void> *)&local_98,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (pPVar3,(function<void_()> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  pPVar3 = &((promise->super_QPromiseBase<void>).m_d.d)->super_PromiseDataBase<void,_void_()>;
  local_90 = local_a8;
  if (local_a8 != (Data *)0x0) {
    LOCK();
    (local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88 = local_98.d;
  if (local_98.d != (Data *)0x0) {
    LOCK();
    ((local_98.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_80 = __return_storage_ptr__;
  local_68._M_unused._M_object = operator_new(0x18);
  *(Data **)local_68._M_unused._0_8_ = local_90;
  if (local_90 != (Data *)0x0) {
    LOCK();
    (local_90->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_90->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_68._M_unused._0_8_ + 8) = local_88;
  if (local_88 == (Data *)0x0) {
    *(QString **)((long)local_68._M_unused._0_8_ + 0x10) = local_80;
    pcStack_50 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    (local_88->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_88->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(QString **)((long)local_68._M_unused._0_8_ + 0x10) = local_80;
    pcStack_50 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
    if (local_88 != (Data *)0x0) {
      LOCK();
      (local_88->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (local_88->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
          ._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(local_88,0x10);
      }
    }
  }
  if (local_90 != (Data *)0x0) {
    LOCK();
    (local_90->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_90->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_90,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (pPVar3,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_98.d != (Data *)0x0) {
    LOCK();
    ((local_98.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_98.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_98.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_98.d,0x10);
    }
  }
  if (local_a8 != (Data *)0x0) {
    LOCK();
    (local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_a8,0x10);
    }
  }
  if (local_a0.d != (Data *)0x0) {
    LOCK();
    ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_a0.d,0x10);
    }
  }
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&((promise->super_QPromiseBase<void>).m_d.d)->
                      super_PromiseDataBase<void,_void_()>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&((promise->super_QPromiseBase<void>).m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this);
  pQVar6 = (QString *)CONCAT71(extraout_var,bVar4);
  while ((char)pQVar6 != '\0') {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this);
    pQVar6 = (QString *)CONCAT71(extraout_var_00,bVar4);
  }
  LOCK();
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    iVar5 = (*this->_vptr_PromiseDataBase[1])(this);
    pQVar6 = (QString *)CONCAT44(extraout_var_01,iVar5);
  }
  LOCK();
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    iVar5 = (*this->_vptr_PromiseDataBase[1])(this);
    pQVar6 = (QString *)CONCAT44(extraout_var_02,iVar5);
  }
  return pQVar6;
}

Assistant:

static inline E waitForError(const QtPromise::QPromise<void>& promise, const E& initial)
{
    E error(initial);
    promise
        .fail([&](const E& err) {
            error = err;
        })
        .wait();
    return error;
}